

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_pool32a0_nanomips_insn(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  TCGContext_conflict6 *s;
  TCGv_ptr pTVar2;
  TCGv_i64 arg1;
  uint uVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  uintptr_t o;
  TCGv_i64 pTVar6;
  uintptr_t o_2;
  uintptr_t o_16;
  TCGv_i64 pTVar7;
  int opc;
  uint32_t uVar8;
  TCGOpcode TVar9;
  code *pcVar10;
  TCGTemp *pTVar11;
  uint rd;
  uintptr_t o_6;
  uint rt;
  uintptr_t o_3;
  uint rs;
  uintptr_t o_4;
  TCGTemp *args [1];
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_50;
  TCGv_i64 local_48;
  TCGTemp *local_40;
  TCGv_i64 local_38;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  rt = uVar1 >> 0x15 & 0x1f;
  rs = uVar1 >> 0x10 & 0x1f;
  rd = uVar1 >> 0xb & 0x1f;
  uVar3 = uVar1 >> 3 & 0x7f;
  if (0x37 < uVar3) {
    if (uVar3 < 0x62) {
      switch(uVar3) {
      case 0x38:
        if ((ctx->CP0_Config5 & 0x200000) != 0) {
          generate_exception_err(ctx,0x14,0);
        }
        gen_rdhwr(ctx,rt,rs,ctx->opcode >> 0xb & 7);
        return;
      default:
        goto switchD_0099926e_caseD_4;
      case 0x3a:
        uVar8 = 0x23;
        goto LAB_00999792;
      case 0x3b:
        opc = 0xdb;
        goto LAB_009997c0;
      case 0x42:
        if ((uVar1 >> 10 & 1) == 0) {
          uVar8 = 10;
        }
        else {
          uVar8 = 0xb;
        }
        gen_cond_move(ctx,uVar8,rd,rs,rt);
        return;
      case 0x45:
        if ((ctx->CP0_Config3 & 4) == 0) {
          generate_exception_err(ctx,0x14,0);
        }
        pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        if (rt == 0) {
          TVar9 = INDEX_op_movi_i64;
          pTVar7 = (TCGv_i64)0x0;
LAB_009998fc:
          tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar4,(TCGArg)pTVar7);
        }
        else if (s->cpu_gpr[rt] != (TCGv_i64)((long)pTVar4 - (long)s)) {
          pTVar7 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[rt]);
          TVar9 = INDEX_op_mov_i64;
          goto LAB_009998fc;
        }
        if (rs == 0) {
          TVar9 = INDEX_op_movi_i64;
          pTVar7 = (TCGv_i64)0x0;
LAB_00999939:
          tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar5,(TCGArg)pTVar7);
        }
        else if (s->cpu_gpr[rs] != (TCGv_i64)((long)pTVar5 - (long)s)) {
          pTVar7 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[rs]);
          TVar9 = INDEX_op_mov_i64;
          goto LAB_00999939;
        }
        pTVar11 = (TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)s) + (long)s);
        pTVar4 = (TCGTemp *)((TCGv_i64)((long)pTVar5 - (long)s) + (long)s);
        local_68 = pTVar11;
        local_60 = pTVar4;
        tcg_gen_callN_mips64el(s,helper_fork_mips64el,(TCGTemp *)0x0,2,&local_68);
        tcg_temp_free_internal_mips64el(s,pTVar11);
LAB_00999cf1:
        tcg_temp_free_internal_mips64el(s,pTVar4);
        return;
      case 0x46:
      case 0x47:
        if ((ctx->hflags & 0x10) == 0) {
          generate_exception_err(ctx,0x13,0);
        }
        if (rd != 0) {
          uVar1 = ctx->opcode;
          gen_mftr(env,ctx,rs,rt,uVar1 >> 10 & 1,uVar1 >> 0xb & 0x1f,uVar1 >> 3 & 1);
          return;
        }
        return;
      case 0x4a:
        uVar8 = 0x24;
        break;
      case 0x4d:
        if ((ctx->CP0_Config3 & 4) == 0) {
          generate_exception_err(ctx,0x14,0);
        }
        pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        pTVar7 = (TCGv_i64)((long)pTVar5 - (long)s);
        if (rs == 0) {
          TVar9 = INDEX_op_movi_i64;
          pTVar6 = (TCGv_i64)0x0;
LAB_00999989:
          tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar5,(TCGArg)pTVar6);
        }
        else if (s->cpu_gpr[rs] != pTVar7) {
          pTVar6 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[rs]);
          TVar9 = INDEX_op_mov_i64;
          goto LAB_00999989;
        }
        local_68 = (TCGTemp *)(s->cpu_env + (long)s);
        pTVar4 = (TCGTemp *)((long)s + (long)pTVar7);
        local_60 = pTVar4;
        tcg_gen_callN_mips64el(s,helper_yield_mips64el,pTVar4,2,&local_68);
        if ((rt != 0) && (s->cpu_gpr[rt] != pTVar7)) {
          tcg_gen_op2_mips64el
                    (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[rt]),
                     (TCGArg)pTVar5);
        }
        goto LAB_00999cf1;
      case 0x4e:
      case 0x4f:
        if ((ctx->hflags & 0x10) == 0) {
          generate_exception_err(ctx,0x13,0);
        }
        uVar1 = ctx->opcode;
        gen_mttr(env,ctx,rs,rt,uVar1 >> 10 & 1,uVar1 >> 0xb & 0x1f,uVar1 >> 3 & 1);
        return;
      case 0x52:
        uVar8 = 0x25;
        break;
      case 0x56:
        pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        pTVar7 = (TCGv_i64)((long)pTVar4 - (long)s);
        if ((uVar1 >> 10 & 1) == 0) {
          if (rs == 0) {
            check_cp0_mt(ctx);
            pTVar2 = s->cpu_env;
            pcVar10 = helper_dvpe_mips64el;
LAB_00999cb0:
            local_68 = (TCGTemp *)(pTVar2 + (long)s);
            tcg_gen_callN_mips64el(s,pcVar10,(TCGTemp *)((long)s + (long)pTVar7),1,&local_68);
            if (rt != 0) {
              pTVar6 = s->cpu_gpr[rt];
              goto joined_r0x00999cd3;
            }
          }
          else {
            if (rs == 1) {
              check_cp0_mt(ctx);
              pcVar10 = helper_dmt_mips64el;
              goto LAB_00999855;
            }
LAB_00999bd3:
            generate_exception_err(ctx,0x14,0);
          }
        }
        else {
          if (rs == 0) {
            check_cp0_mt(ctx);
            pTVar2 = s->cpu_env;
            pcVar10 = helper_evpe_mips64el;
            goto LAB_00999cb0;
          }
          if (rs != 1) goto LAB_00999bd3;
          check_cp0_mt(ctx);
          pcVar10 = helper_emt_mips64el;
LAB_00999855:
          tcg_gen_callN_mips64el(s,pcVar10,(TCGTemp *)((long)s + (long)pTVar7),0,(TCGTemp **)0x0);
          if (rt == 0) goto LAB_00999ceb;
          pTVar6 = s->cpu_gpr[rt];
joined_r0x00999cd3:
          if (pTVar6 != pTVar7) {
            tcg_gen_op2_mips64el
                      (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)pTVar6),(TCGArg)pTVar4
                      );
          }
        }
LAB_00999ceb:
        pTVar4 = (TCGTemp *)(pTVar7 + (long)s);
        goto LAB_00999cf1;
      case 0x5a:
        uVar8 = 0x27;
      }
LAB_00999735:
      gen_logic(ctx,uVar8,rd,rs,rt);
      return;
    }
    if (uVar3 < 0x72) {
      if (uVar3 == 0x62) {
        uVar8 = 0x26;
        goto LAB_00999735;
      }
      if (uVar3 == 0x6a) {
        uVar8 = 0x2a;
        goto LAB_00999762;
      }
      goto switchD_0099926e_caseD_4;
    }
    if (uVar3 == 0x72) {
      if (rd != 0) {
        uVar8 = 0x2b;
LAB_00999762:
        gen_slt(ctx,uVar8,rd,rs,rt);
        return;
      }
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar7 = (TCGv_i64)((long)pTVar4 - (long)s);
      if ((ctx->opcode & 0x400) == 0) {
        if (ctx->vp != false) {
          if ((ctx->hflags & 0x10) == 0) {
            generate_exception_err(ctx,0x13,0);
          }
          local_68 = (TCGTemp *)(s->cpu_env + (long)s);
          tcg_gen_callN_mips64el
                    (s,helper_dvp_mips64el,(TCGTemp *)((long)s + (long)pTVar7),1,&local_68);
          if (rt != 0) {
            pTVar6 = s->cpu_gpr[rt];
LAB_00999c34:
            if (pTVar6 != pTVar7) {
              tcg_gen_op2_mips64el
                        (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)pTVar6),
                         (TCGArg)pTVar4);
            }
          }
        }
      }
      else if (ctx->vp != false) {
        if ((ctx->hflags & 0x10) == 0) {
          generate_exception_err(ctx,0x13,0);
        }
        local_68 = (TCGTemp *)(s->cpu_env + (long)s);
        tcg_gen_callN_mips64el
                  (s,helper_evp_mips64el,(TCGTemp *)((long)s + (long)pTVar7),1,&local_68);
        if (rt != 0) {
          pTVar6 = s->cpu_gpr[rt];
          goto LAB_00999c34;
        }
      }
      pTVar4 = (TCGTemp *)(pTVar7 + (long)s);
      goto LAB_00999cf1;
    }
    if (uVar3 != 0x7a) goto switchD_0099926e_caseD_4;
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar7 = (TCGv_i64)((long)pTVar5 - (long)s);
    local_40 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    local_50 = pTVar5;
    local_38 = pTVar7;
    if (rs == 0) {
      TVar9 = INDEX_op_movi_i64;
      pTVar7 = (TCGv_i64)0x0;
LAB_00999a0a:
      tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar5,(TCGArg)pTVar7);
    }
    else if (s->cpu_gpr[rs] != pTVar7) {
      pTVar7 = s->cpu_gpr[rs] + (long)s;
      TVar9 = INDEX_op_mov_i64;
      goto LAB_00999a0a;
    }
    pTVar5 = local_40;
    pTVar7 = (TCGv_i64)((long)pTVar4 - (long)s);
    local_48 = (TCGv_i64)((long)local_40 - (long)s);
    if (rt == 0) {
      TVar9 = INDEX_op_movi_i64;
      pTVar6 = (TCGv_i64)0x0;
LAB_00999a59:
      tcg_gen_op2_mips64el(s,TVar9,(TCGArg)local_40,(TCGArg)pTVar6);
    }
    else if (s->cpu_gpr[rt] != local_48) {
      pTVar6 = s->cpu_gpr[rt] + (long)s;
      TVar9 = INDEX_op_mov_i64;
      goto LAB_00999a59;
    }
    pTVar11 = local_50;
    tcg_gen_op3_mips64el(s,INDEX_op_add_i64,(TCGArg)pTVar4,(TCGArg)local_50,(TCGArg)pTVar5);
    tcg_gen_ext32s_i64_mips64el(s,pTVar7,pTVar7);
    tcg_gen_op3_mips64el(s,INDEX_op_xor_i64,(TCGArg)pTVar11,(TCGArg)pTVar11,(TCGArg)pTVar5);
    tcg_gen_op3_mips64el(s,INDEX_op_xor_i64,(TCGArg)pTVar5,(TCGArg)pTVar4,(TCGArg)pTVar5);
    arg1 = local_38;
    pTVar6 = local_48;
    tcg_gen_andc_i64_mips64el(s,local_38,local_48,local_38);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_LT,pTVar7,arg1,0);
    if ((rd != 0) && (s->cpu_gpr[rd] != pTVar7)) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rd] + (long)s),(TCGArg)pTVar4);
    }
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar7 + (long)s));
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg1 + (long)s));
    goto LAB_00999b3e;
  }
  switch(uVar3) {
  case 0:
    if ((uVar1 >> 10 & 1) == 0) {
      if (((uint)ctx->CP0_Config5 >> 0x15 & 1) != 0) {
        generate_exception_err(ctx,0x14,0);
      }
      uVar8 = 0x34;
    }
    else {
      if (((uint)ctx->CP0_Config5 >> 0x15 & 1) != 0) {
        generate_exception_err(ctx,0x14,0);
      }
      uVar8 = 0x36;
    }
    gen_trap(ctx,uVar8,rs,rt,-1);
    return;
  case 1:
    if ((ctx->CP0_Config5 & 0x200000) != 0) {
      generate_exception_err(ctx,0x14,0);
    }
    uVar8 = 0x7c000420;
    goto LAB_009994e5;
  case 2:
    uVar8 = 4;
    goto LAB_00999520;
  case 3:
    opc = 0x98;
    break;
  case 4:
  case 5:
  case 7:
  case 8:
  case 0xc:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
switchD_0099926e_caseD_4:
    generate_exception_err(ctx,0x14,0);
    return;
  case 6:
    if ((ctx->hflags & 0x10) == 0) {
      generate_exception_err(ctx,0x13,0);
    }
    if (rt != 0) {
      gen_mfc0(ctx,s->cpu_gpr[rt],rs,ctx->opcode >> 0xb & 7);
      return;
    }
    return;
  case 9:
    uVar8 = 0x7c000620;
LAB_009994e5:
    gen_bshfl(ctx,uVar8,rs,rt);
    return;
  case 10:
    uVar8 = 6;
    goto LAB_00999520;
  case 0xb:
    opc = 0xd8;
    break;
  case 0xe:
    if ((ctx->hflags & 0x10) == 0) {
      generate_exception_err(ctx,0x13,0);
    }
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar6 = (TCGv_i64)((long)pTVar4 - (long)s);
    if (rt == 0) {
      TVar9 = INDEX_op_movi_i64;
      pTVar7 = (TCGv_i64)0x0;
LAB_009998c3:
      tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar4,(TCGArg)pTVar7);
    }
    else if (s->cpu_gpr[rt] != pTVar6) {
      pTVar7 = s->cpu_gpr[rt] + (long)s;
      TVar9 = INDEX_op_mov_i64;
      goto LAB_009998c3;
    }
    gen_mtc0(ctx,pTVar6,rs,ctx->opcode >> 0xb & 7);
LAB_00999b3e:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar6 + (long)s));
    return;
  case 0x12:
    uVar8 = 7;
    goto LAB_00999520;
  case 0x13:
    opc = 0x99;
    break;
  case 0x1a:
    uVar8 = 0x46;
LAB_00999520:
    gen_shift(ctx,uVar8,rd,rt,rs);
    return;
  case 0x1b:
    opc = 0xd9;
    break;
  case 0x22:
    uVar8 = 0x20;
    goto LAB_00999792;
  case 0x23:
    opc = 0x9a;
    break;
  default:
    switch(uVar3) {
    case 0x2a:
      uVar8 = 0x21;
      goto LAB_00999792;
    case 0x2b:
      opc = 0xda;
      break;
    default:
      goto switchD_0099926e_caseD_4;
    case 0x32:
      if ((ctx->CP0_Config5 & 0x200000) != 0) {
        generate_exception_err(ctx,0x14,0);
      }
      uVar8 = 0x22;
LAB_00999792:
      gen_arith(ctx,uVar8,rd,rs,rt);
      return;
    case 0x33:
      opc = 0x9b;
    }
  }
LAB_009997c0:
  gen_r6_muldiv(ctx,opc,rd,rs,rt);
  return;
}

Assistant:

static void gen_pool32a0_nanomips_insn(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = extract32(ctx->opcode, 21, 5);
    int rs = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (extract32(ctx->opcode, 3, 7)) {
    case NM_P_TRAP:
        switch (extract32(ctx->opcode, 10, 1)) {
        case NM_TEQ:
            check_nms(ctx);
            gen_trap(ctx, OPC_TEQ, rs, rt, -1);
            break;
        case NM_TNE:
            check_nms(ctx);
            gen_trap(ctx, OPC_TNE, rs, rt, -1);
            break;
        }
        break;
    case NM_RDHWR:
        check_nms(ctx);
        gen_rdhwr(ctx, rt, rs, extract32(ctx->opcode, 11, 3));
        break;
    case NM_SEB:
        check_nms(ctx);
        gen_bshfl(ctx, OPC_SEB, rs, rt);
        break;
    case NM_SEH:
        gen_bshfl(ctx, OPC_SEH, rs, rt);
        break;
    case NM_SLLV:
        gen_shift(ctx, OPC_SLLV, rd, rt, rs);
        break;
    case NM_SRLV:
        gen_shift(ctx, OPC_SRLV, rd, rt, rs);
        break;
    case NM_SRAV:
        gen_shift(ctx, OPC_SRAV, rd, rt, rs);
        break;
    case NM_ROTRV:
        gen_shift(ctx, OPC_ROTRV, rd, rt, rs);
        break;
    case NM_ADD:
        gen_arith(ctx, OPC_ADD, rd, rs, rt);
        break;
    case NM_ADDU:
        gen_arith(ctx, OPC_ADDU, rd, rs, rt);
        break;
    case NM_SUB:
        check_nms(ctx);
        gen_arith(ctx, OPC_SUB, rd, rs, rt);
        break;
    case NM_SUBU:
        gen_arith(ctx, OPC_SUBU, rd, rs, rt);
        break;
    case NM_P_CMOVE:
        switch (extract32(ctx->opcode, 10, 1)) {
        case NM_MOVZ:
            gen_cond_move(ctx, OPC_MOVZ, rd, rs, rt);
            break;
        case NM_MOVN:
            gen_cond_move(ctx, OPC_MOVN, rd, rs, rt);
            break;
        }
        break;
    case NM_AND:
        gen_logic(ctx, OPC_AND, rd, rs, rt);
        break;
    case NM_OR:
        gen_logic(ctx, OPC_OR, rd, rs, rt);
        break;
    case NM_NOR:
        gen_logic(ctx, OPC_NOR, rd, rs, rt);
        break;
    case NM_XOR:
        gen_logic(ctx, OPC_XOR, rd, rs, rt);
        break;
    case NM_SLT:
        gen_slt(ctx, OPC_SLT, rd, rs, rt);
        break;
    case NM_P_SLTU:
        if (rd == 0) {
            /* P_DVP */
            TCGv t0 = tcg_temp_new(tcg_ctx);
            switch (extract32(ctx->opcode, 10, 1)) {
            case NM_DVP:
                if (ctx->vp) {
                    check_cp0_enabled(ctx);
                    gen_helper_dvp(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                }
                break;
            case NM_EVP:
                if (ctx->vp) {
                    check_cp0_enabled(ctx);
                    gen_helper_evp(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                }
                break;
            }
            tcg_temp_free(tcg_ctx, t0);
        } else {
            gen_slt(ctx, OPC_SLTU, rd, rs, rt);
        }
        break;
    case NM_SOV:
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_add_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_xor_tl(tcg_ctx, t1, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t0, t2);
            tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);

            /* operands of same sign, result different sign */
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, t0, t1, 0);
            gen_store_gpr(tcg_ctx, t0, rd);

            tcg_temp_free(tcg_ctx, t0);
            tcg_temp_free(tcg_ctx, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case NM_MUL:
        gen_r6_muldiv(ctx, R6_OPC_MUL, rd, rs, rt);
        break;
    case NM_MUH:
        gen_r6_muldiv(ctx, R6_OPC_MUH, rd, rs, rt);
        break;
    case NM_MULU:
        gen_r6_muldiv(ctx, R6_OPC_MULU, rd, rs, rt);
        break;
    case NM_MUHU:
        gen_r6_muldiv(ctx, R6_OPC_MUHU, rd, rs, rt);
        break;
    case NM_DIV:
        gen_r6_muldiv(ctx, R6_OPC_DIV, rd, rs, rt);
        break;
    case NM_MOD:
        gen_r6_muldiv(ctx, R6_OPC_MOD, rd, rs, rt);
        break;
    case NM_DIVU:
        gen_r6_muldiv(ctx, R6_OPC_DIVU, rd, rs, rt);
        break;
    case NM_MODU:
        gen_r6_muldiv(ctx, R6_OPC_MODU, rd, rs, rt);
        break;
    case NM_MFC0:
        check_cp0_enabled(ctx);
        if (rt == 0) {
            /* Treat as NOP. */
            break;
        }
        gen_mfc0(ctx, tcg_ctx->cpu_gpr[rt], rs, extract32(ctx->opcode, 11, 3));
        break;
    case NM_MTC0:
        check_cp0_enabled(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rt);
            gen_mtc0(ctx, t0, rs, extract32(ctx->opcode, 11, 3));
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case NM_D_E_MT_VPE:
        {
            uint8_t sc = extract32(ctx->opcode, 10, 1);
            TCGv t0 = tcg_temp_new(tcg_ctx);

            switch (sc) {
            case 0:
                if (rs == 1) {
                    /* DMT */
                    check_cp0_mt(ctx);
                    gen_helper_dmt(tcg_ctx, t0);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else if (rs == 0) {
                    /* DVPE */
                    check_cp0_mt(ctx);
                    gen_helper_dvpe(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else {
                    generate_exception_end(ctx, EXCP_RI);
                }
                break;
            case 1:
                if (rs == 1) {
                    /* EMT */
                    check_cp0_mt(ctx);
                    gen_helper_emt(tcg_ctx, t0);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else if (rs == 0) {
                    /* EVPE */
                    check_cp0_mt(ctx);
                    gen_helper_evpe(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else {
                    generate_exception_end(ctx, EXCP_RI);
                }
                break;
            }

            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case NM_FORK:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rt);
            gen_load_gpr(tcg_ctx, t1, rs);
            gen_helper_fork(tcg_ctx, t0, t1);
            tcg_temp_free(tcg_ctx, t0);
            tcg_temp_free(tcg_ctx, t1);
        }
        break;
    case NM_MFTR:
    case NM_MFHTR:
        check_cp0_enabled(ctx);
        if (rd == 0) {
            /* Treat as NOP. */
            return;
        }
        gen_mftr(env, ctx, rs, rt, extract32(ctx->opcode, 10, 1),
                 extract32(ctx->opcode, 11, 5), extract32(ctx->opcode, 3, 1));
        break;
    case NM_MTTR:
    case NM_MTHTR:
        check_cp0_enabled(ctx);
        gen_mttr(env, ctx, rs, rt, extract32(ctx->opcode, 10, 1),
                 extract32(ctx->opcode, 11, 5), extract32(ctx->opcode, 3, 1));
        break;
    case NM_YIELD:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rs);
            gen_helper_yield(tcg_ctx, t0, tcg_ctx->cpu_env, t0);
            gen_store_gpr(tcg_ctx, t0, rt);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}